

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Regexp * re2::Regexp::StarPlusOrQuest(RegexpOp op,Regexp *sub,ParseFlags flags)

{
  RegexpOp RVar1;
  ParseFlags PVar2;
  ParseFlags PVar3;
  Regexp *pRVar4;
  Regexp **ppRVar5;
  ParseFlags in_EDX;
  Regexp *in_RSI;
  RegexpOp in_EDI;
  Regexp *re;
  Regexp *re_1;
  ParseFlags in_stack_ffffffffffffff88;
  RegexpOp in_stack_ffffffffffffff8c;
  Regexp *in_stack_ffffffffffffff90;
  Regexp *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  ParseFlags PVar6;
  Regexp *local_8;
  
  RVar1 = Regexp::op(in_RSI);
  PVar6 = in_EDX;
  local_8 = in_RSI;
  if ((in_EDI != RVar1) || (PVar2 = parse_flags(in_RSI), in_EDX != PVar2)) {
    RVar1 = Regexp::op(in_RSI);
    if (((RVar1 == kRegexpStar) ||
        ((RVar1 = Regexp::op(in_RSI), RVar1 == kRegexpPlus ||
         (RVar1 = Regexp::op(in_RSI), RVar1 == kRegexpQuest)))) &&
       (PVar2 = PVar6, PVar3 = parse_flags(in_RSI), PVar6 == PVar3)) {
      RVar1 = Regexp::op(in_RSI);
      if (RVar1 != kRegexpStar) {
        local_8 = (Regexp *)operator_new(0x28);
        Regexp(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
        AllocSub(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        Regexp::sub(in_RSI);
        pRVar4 = Incref(in_stack_ffffffffffffffc8);
        ppRVar5 = Regexp::sub(local_8);
        *ppRVar5 = pRVar4;
        Decref((Regexp *)CONCAT44(PVar2,in_stack_ffffffffffffffe0));
      }
    }
    else {
      local_8 = (Regexp *)operator_new(0x28);
      Regexp(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      AllocSub(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      ppRVar5 = Regexp::sub(local_8);
      *ppRVar5 = in_RSI;
    }
  }
  return local_8;
}

Assistant:

Regexp* Regexp::StarPlusOrQuest(RegexpOp op, Regexp* sub, ParseFlags flags) {
  // Squash **, ++ and ??.
  if (op == sub->op() && flags == sub->parse_flags())
    return sub;

  // Squash *+, *?, +*, +?, ?* and ?+. They all squash to *, so because
  // op is Star/Plus/Quest, we just have to check that sub->op() is too.
  if ((sub->op() == kRegexpStar ||
       sub->op() == kRegexpPlus ||
       sub->op() == kRegexpQuest) &&
      flags == sub->parse_flags()) {
    // If sub is Star, no need to rewrite it.
    if (sub->op() == kRegexpStar)
      return sub;

    // Rewrite sub to Star.
    Regexp* re = new Regexp(kRegexpStar, flags);
    re->AllocSub(1);
    re->sub()[0] = sub->sub()[0]->Incref();
    sub->Decref();  // We didn't consume the reference after all.
    return re;
  }

  Regexp* re = new Regexp(op, flags);
  re->AllocSub(1);
  re->sub()[0] = sub;
  return re;
}